

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTP_Server.cpp
# Opt level: O1

Host * __thiscall Jupiter::HTTP::Server::Data::find_host(Data *this,string_view name)

{
  pointer puVar1;
  Host *pHVar2;
  size_type sVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  size_t __n;
  unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_> *host;
  size_t sVar7;
  pointer puVar8;
  Host *unaff_R13;
  bool bVar9;
  
  __n = name._M_len;
  if (__n == 0) {
    uVar6 = 0;
  }
  else {
    sVar7 = 0;
    uVar6 = 0;
    do {
      iVar5 = jessilib::fold((int)name._M_str[sVar7]);
      uVar6 = uVar6 + iVar5;
      sVar7 = sVar7 + 1;
    } while (__n != sVar7);
  }
  puVar8 = (this->m_hosts).
           super__Vector_base<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->m_hosts).
           super__Vector_base<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (puVar8 == puVar1) {
      return (Host *)0x0;
    }
    pHVar2 = (puVar8->_M_t).
             super___uniq_ptr_impl<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>
             ._M_t.
             super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Host_*,_std::default_delete<Jupiter::HTTP::Server::Host>_>
             .super__Head_base<0UL,_Jupiter::HTTP::Server::Host_*,_false>._M_head_impl;
    bVar4 = true;
    if (uVar6 == (pHVar2->super_Directory).name_checksum) {
      sVar3 = *(size_type *)((long)&(pHVar2->super_Directory).name + 8);
      bVar9 = sVar3 == __n;
      if ((__n != 0) && (sVar3 == __n)) {
        iVar5 = bcmp(name._M_str,(pHVar2->super_Directory).name._M_dataplus._M_p,__n);
        bVar9 = iVar5 == 0;
      }
      bVar4 = (bool)(bVar9 ^ 1);
      if (bVar9) {
        unaff_R13 = pHVar2;
      }
    }
    if (!bVar4) break;
    puVar8 = puVar8 + 1;
  }
  return unaff_R13;
}

Assistant:

Jupiter::HTTP::Server::Host *Jupiter::HTTP::Server::Data::find_host(std::string_view name) {
	unsigned int name_checksum = calc_checksumi(name);
	for (const auto& host : m_hosts) {
		if (name_checksum == host->name_checksum && host->name == name) {
			return host.get();
		}
	}

	return nullptr;
}